

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void execute(Grasp *grasp,seconds timeout)

{
  long lVar1;
  thread t;
  unique_lock<std::mutex> l;
  mutex m;
  condition_variable cv;
  long local_a0;
  unique_lock<std::mutex> local_98;
  __pthread_internal_list local_88;
  __native_type local_78;
  condition_variable local_48 [48];
  
  local_78.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_78._16_8_ = 0;
  local_78.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_78.__align = 0;
  local_78._8_8_ = 0;
  local_88.__prev = (__pthread_internal_list *)grasp;
  std::condition_variable::condition_variable(local_48);
  local_a0 = 0;
  local_98._M_device = (mutex_type *)operator_new(0x20);
  ((local_98._M_device)->super___mutex_base)._M_mutex.__align = (long)&PTR___State_00127cc0;
  *(__native_type **)((long)&((local_98._M_device)->super___mutex_base)._M_mutex + 8) = &local_78;
  *(condition_variable **)((long)&((local_98._M_device)->super___mutex_base)._M_mutex + 0x10) =
       local_48;
  ((local_98._M_device)->super___mutex_base)._M_mutex.__data.__list.__prev = &local_88;
  std::thread::_M_start_thread(&local_a0,&local_98,0);
  if (local_98._M_device != (mutex_type *)0x0) {
    (**(code **)(((local_98._M_device)->super___mutex_base)._M_mutex.__align + 8))();
  }
  std::thread::detach();
  local_98._M_owns = false;
  local_98._M_device = (mutex_type *)&local_78;
  std::unique_lock<std::mutex>::lock(&local_98);
  local_98._M_owns = true;
  lVar1 = std::chrono::_V2::steady_clock::now();
  local_88.__next = (__pthread_internal_list *)(timeout.__r * 1000000000 + lVar1);
  std::condition_variable::__wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (local_48,&local_98,
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)&local_88.__next);
  std::unique_lock<std::mutex>::~unique_lock(&local_98);
  if (local_a0 == 0) {
    std::condition_variable::~condition_variable(local_48);
    return;
  }
  std::terminate();
}

Assistant:

void execute(Grasp *grasp, chrono::seconds timeout) {
    mutex m;
    condition_variable cv;

    thread t([&m, &cv, &grasp]()
             {
                 grasp->run(true);
                 cv.notify_one();
             });

    t.detach();

    unique_lock<mutex> l(m);
    cv.wait_for(l, timeout);
}